

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void * matras_alloc_range(matras *m,matras_id_t *id,matras_id_t range_count)

{
  void *res;
  matras_id_t range_count_local;
  matras_id_t *id_local;
  matras *m_local;
  
  if (m->capacity < (m->head).block_count) {
    __assert_fail("m->head.block_count <= m->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x133,"void *matras_alloc_range(struct matras *, matras_id_t *, matras_id_t)");
  }
  if ((m->head).block_count % (ulong)range_count != 0) {
    __assert_fail("m->head.block_count % range_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x134,"void *matras_alloc_range(struct matras *, matras_id_t *, matras_id_t)");
  }
  if ((int)(((ulong)m->extent_size / (ulong)m->block_size) % (ulong)range_count) != 0) {
    __assert_fail("m->extent_size / m->block_size % range_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x135,"void *matras_alloc_range(struct matras *, matras_id_t *, matras_id_t)");
  }
  if (m->capacity < (m->head).block_count + (ulong)range_count) {
    m_local = (matras *)0x0;
  }
  else {
    m_local = (matras *)matras_alloc_internal(m);
    if (m_local != (matras *)0x0) {
      *id = (matras_id_t)(m->head).block_count;
      (m->head).block_count = (ulong)range_count + (m->head).block_count;
    }
  }
  return m_local;
}

Assistant:

void *
matras_alloc_range(struct matras *m, matras_id_t *id, matras_id_t range_count)
{
	assert(m->head.block_count <= m->capacity);
	assert(m->head.block_count % range_count == 0);
	assert(m->extent_size / m->block_size % range_count == 0);

	if (m->head.block_count + range_count > m->capacity) {
		/* No space left for range_count. */
		return NULL;
	}
	void *res = matras_alloc_internal(m);
	if (res != NULL) {
		*id = m->head.block_count;
		m->head.block_count += range_count;
	}
	return res;
}